

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManPrint(If_DsdMan_t *p,char *pFileName,int Number,int Support,int fOccurs,int fTtDump,
                   int fVerbose)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Vec_Vec_t *p_01;
  int iVar2;
  int iVar3;
  uint uVar4;
  FILE *__s;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  void *pvVar7;
  int *piVar8;
  char *pcVar9;
  abctime extraout_RDX;
  abctime extraout_RDX_00;
  abctime time;
  abctime time_00;
  abctime time_01;
  abctime time_02;
  abctime time_03;
  int iVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double local_48;
  
  __s = _stdout;
  if ((pFileName != (char *)0x0) && (__s = fopen(pFileName,"wb"), __s == (FILE *)0x0)) {
    puts("cannot open output file");
    return;
  }
  if (fVerbose != 0) {
    fwrite("*****  NOTATIONS USED BELOW  *****\n",0x23,1,__s);
    fwrite("Support -- the support size\n",0x1c,1,__s);
    fwrite("Obj     -- the number of nodes in the DSD manager for each support size\n",0x48,1,__s);
    fwrite("           (the constant node and the primary input node have no support)\n",0x4a,1,__s)
    ;
    fwrite("ObjNDSD -- the number of prime nodes (that is, nodes whose function has no DSD)\n",0x50,
           1,__s);
    fwrite("           (percentage is relative to the number of all nodes of that size)\n",0x4c,1,
           __s);
    fwrite("NPNNDSD -- the number of different NPN classes of prime nodes\n",0x3e,1,__s);
    fwrite("           (Each NPN class may appear more than once. For example: F1 = 17(ab(cd))\n",
           0x53,1,__s);
    fwrite("           and F2 = 17(ab[cd]) both have prime majority node (hex TT is 17),\n",0x4d,1,
           __s);
    fwrite("           but in one case the majority node is fed by AND, and in another by XOR.\n",
           0x53,1,__s);
    fwrite("           These two majority nodes are different nodes in the DSD manager\n",0x4b,1,__s
          );
    fwrite("Str     -- the number of structures for each support size\n",0x3a,1,__s);
    fwrite("           (each structure is composed of one or more nodes)\n",0x3d,1,__s);
    fwrite("StrNDSD -- the number of DSD structures containing at least one prime node\n",0x4b,1,__s
          );
    fwrite("Marked  -- the number of DSD structures matchable with the LUT structure (say, \"44\")\n"
           ,0x55,1,__s);
  }
  p_00 = &p->vObjs;
  for (iVar10 = 0; iVar10 < (p->vObjs).nSize; iVar10 = iVar10 + 1) {
    piVar5 = (int *)Vec_PtrEntry(p_00,iVar10);
    If_DsdManCheckNonDec_rec(p,*piVar5);
    If_DsdVecObjRef(p_00,*piVar5);
    If_DsdVecObjMark(p_00,iVar10);
  }
  iVar17 = 0;
  iVar10 = 0;
  for (lVar15 = 3; lVar15 <= p->nVars; lVar15 = lVar15 + 1) {
    p_01 = (Vec_Vec_t *)p->vTtDecs[lVar15];
    iVar3 = p->vTtMem[lVar15]->nEntries;
    iVar1 = p->vTtMem[lVar15]->nEntrySize;
    if (p_01 == (Vec_Vec_t *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = p_01->nCap;
      auVar19._8_4_ = iVar2 >> 0x1f;
      auVar19._0_8_ = (long)iVar2;
      auVar19._12_4_ = 0x45300000;
      local_48 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 8.0 + 16.0;
      for (lVar11 = 0; lVar11 < p_01->nSize; lVar11 = lVar11 + 1) {
        pVVar6 = Vec_VecEntry(p_01,(int)lVar11);
        if (pVVar6 != (Vec_Ptr_t *)0x0) {
          if (p_01->nSize <= lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                          ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
          }
          if ((int *)p_01->pArray[lVar11] == (int *)0x0) {
            dVar18 = 0.0;
          }
          else {
            iVar2 = *p_01->pArray[lVar11];
            auVar20._8_4_ = iVar2 >> 0x1f;
            auVar20._0_8_ = (long)iVar2;
            auVar20._12_4_ = 0x45300000;
            dVar18 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
          }
          local_48 = local_48 + dVar18;
        }
      }
      iVar2 = (int)local_48;
    }
    iVar17 = iVar17 + iVar3 * iVar1;
    iVar10 = iVar10 + iVar2;
  }
  If_DsdManPrintDistrib(p);
  uVar4 = p->nVars;
  uVar13 = p->LutSize;
  iVar3 = If_DsdManHasMarks(p);
  pcVar12 = "yes";
  pcVar9 = "yes";
  if (iVar3 == 0) {
    pcVar9 = "no";
  }
  if (p->fNewAsUseless == 0) {
    pcVar12 = "no";
  }
  printf("Number of inputs = %d.  LUT size = %d.  Marks = %s.  NewAsUseless = %s.  Bookmark = %d.\n"
         ,(ulong)uVar4,(ulong)uVar13,pcVar9,pcVar12,(ulong)(uint)p->nObjsPrev);
  if (p->pCellStr != (char *)0x0) {
    printf("Symbolic cell description: %s\n");
  }
  if (p->pTtGia != (Gia_Man_t *)0x0) {
    uVar4 = Gia_ManAndNum(p->pTtGia);
    fprintf(__s,"Non-DSD AIG nodes          = %8d\n",(ulong)uVar4);
  }
  fprintf(__s,"Unique table misses        = %8d\n",(ulong)(uint)p->nUniqueMisses);
  fprintf(__s,"Unique table hits          = %8d\n",(ulong)(uint)p->nUniqueHits);
  iVar3 = Mem_FlexReadMemUsage(p->pMem);
  fprintf(__s,"Memory used for objects    = %8.2f MB.\n",(double)iVar3 * 9.5367431640625e-07);
  lVar15 = (long)iVar17 + (long)(p->vTruths).nCap * 4;
  auVar21._8_4_ = (int)((ulong)lVar15 >> 0x20);
  auVar21._0_8_ = lVar15;
  auVar21._12_4_ = 0x45300000;
  fprintf(__s,"Memory used for functions  = %8.2f MB.\n",
          ((auVar21._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) * 8.0 *
          9.5367431640625e-07);
  fprintf(__s,"Memory used for hash table = %8.2f MB.\n",
          (double)((p->vNexts).nCap + p->nBins) * 4.0 * 9.5367431640625e-07);
  fprintf(__s,"Memory used for bound sets = %8.2f MB.\n",(double)iVar10 * 9.5367431640625e-07);
  fprintf(__s,"Memory used for array      = %8.2f MB.\n",
          (double)(p->vObjs).nCap * 8.0 * 9.5367431640625e-07);
  time = extraout_RDX;
  if (p->pTtGia != (Gia_Man_t *)0x0) {
    iVar10 = Gia_ManAndNum(p->pTtGia);
    fprintf(__s,"Memory used for AIG        = %8.2f MB.\n",
            (double)iVar10 * 8.0 * 9.5367431640625e-07);
    time = extraout_RDX_00;
  }
  if ((char *)p->timeDsd != (char *)0x0) {
    Abc_PrintTime(0x7e5e07,(char *)p->timeDsd,time);
    Abc_PrintTime(0x7e5e13,(char *)(p->timeCanon - p->timeCheck),time_00);
    Abc_PrintTime(0x7e5e1f,(char *)p->timeCheck,time_01);
    Abc_PrintTime(0x7e5e2b,(char *)p->timeCheck2,time_02);
    Abc_PrintTime(0x7e5e37,(char *)p->timeVerify,time_03);
  }
  if (fOccurs != 0) {
    If_DsdManPrintOccurs((FILE *)_stdout,p);
  }
  if (fTtDump != 0) {
    If_DsdManDumpDsd(p,Support);
    If_DsdManDumpAll(p,Support);
  }
  if (fVerbose != 0) {
    p_02 = Vec_IntAlloc(1000);
    p_03 = Vec_IntAlloc(1000);
    for (iVar10 = 0; iVar10 < (p->vObjs).nSize; iVar10 = iVar10 + 1) {
      pvVar7 = Vec_PtrEntry(p_00,iVar10);
      if (((Number == 0) || (iVar10 % Number == 0)) &&
         ((Support == 0 || ((*(uint *)((long)pvVar7 + 4) >> 3 & 0x1f) == Support)))) {
        Vec_IntPush(p_02,iVar10);
        Vec_IntPush(p_03,-(*(uint *)((long)pvVar7 + 4) >> 9 & 0x3ffff));
      }
    }
    uVar4 = p_03->nSize;
    piVar5 = Abc_MergeSortCost(p_03->pArray,uVar4);
    uVar13 = 0x14;
    if ((int)uVar4 < 0x14) {
      uVar13 = uVar4;
    }
    uVar14 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar14 = 0;
    }
    uVar16 = 0;
    while (uVar14 != uVar16) {
      printf("%2d : ",uVar16 + 1 & 0xffffffff);
      iVar10 = Vec_IntEntry(p_02,piVar5[uVar16]);
      piVar8 = (int *)Vec_PtrEntry(p_00,iVar10);
      If_DsdManPrintOne((FILE *)__s,p,*piVar8,(uchar *)0x0,1);
      uVar16 = uVar16 + 1;
    }
    free(piVar5);
    Vec_IntFree(p_02);
    Vec_IntFree(p_03);
    if (pFileName != (char *)0x0) {
      fclose(__s);
      return;
    }
  }
  return;
}

Assistant:

void If_DsdManPrint( If_DsdMan_t * p, char * pFileName, int Number, int Support, int fOccurs, int fTtDump, int fVerbose )
{
    If_DsdObj_t * pObj;
    Vec_Int_t * vStructs, * vCounts;
    int CountUsed = 0, CountNonDsd = 0, CountNonDsdStr = 0, CountMarked = 0, CountPrime = 0;
    int i, v, * pPerm, DsdMax = 0, MemSizeTTs = 0, MemSizeDecs = 0;
    FILE * pFile;
    pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    if ( pFileName && pFile == NULL )
    {
        printf( "cannot open output file\n" );
        return;
    }
    if ( fVerbose )
    {
        fprintf( pFile, "*****  NOTATIONS USED BELOW  *****\n" );
        fprintf( pFile, "Support -- the support size\n" );
        fprintf( pFile, "Obj     -- the number of nodes in the DSD manager for each support size\n" );
        fprintf( pFile, "           (the constant node and the primary input node have no support)\n" );
        fprintf( pFile, "ObjNDSD -- the number of prime nodes (that is, nodes whose function has no DSD)\n" );
        fprintf( pFile, "           (percentage is relative to the number of all nodes of that size)\n" );
        fprintf( pFile, "NPNNDSD -- the number of different NPN classes of prime nodes\n" );
        fprintf( pFile, "           (Each NPN class may appear more than once. For example: F1 = 17(ab(cd))\n" ); 
        fprintf( pFile, "           and F2 = 17(ab[cd]) both have prime majority node (hex TT is 17),\n" ); 
        fprintf( pFile, "           but in one case the majority node is fed by AND, and in another by XOR.\n" );
        fprintf( pFile, "           These two majority nodes are different nodes in the DSD manager\n" );
        fprintf( pFile, "Str     -- the number of structures for each support size\n" );
        fprintf( pFile, "           (each structure is composed of one or more nodes)\n" );
        fprintf( pFile, "StrNDSD -- the number of DSD structures containing at least one prime node\n" );
        fprintf( pFile, "Marked  -- the number of DSD structures matchable with the LUT structure (say, \"44\")\n" );
    }
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
            DsdMax = Abc_MaxInt( DsdMax, pObj->nFans ); 
        CountPrime += If_DsdObjType(pObj) == IF_DSD_PRIME;
        CountNonDsdStr += If_DsdManCheckNonDec_rec( p, pObj->Id );
        CountUsed += ( If_DsdVecObjRef(&p->vObjs, pObj->Id) > 0 );
        CountMarked += If_DsdVecObjMark( &p->vObjs, i );
    }
    for ( v = 3; v <= p->nVars; v++ )
    {
        CountNonDsd += Vec_MemEntryNum(p->vTtMem[v]);
        MemSizeTTs += Vec_MemEntrySize(p->vTtMem[v]) * Vec_MemEntryNum(p->vTtMem[v]);
        MemSizeDecs += (int)Vec_VecMemoryInt((Vec_Vec_t *)(p->vTtDecs[v]));
    }
    If_DsdManPrintDistrib( p );
    printf( "Number of inputs = %d.  LUT size = %d.  Marks = %s.  NewAsUseless = %s.  Bookmark = %d.\n", 
        p->nVars, p->LutSize, If_DsdManHasMarks(p)? "yes" : "no", p->fNewAsUseless? "yes" : "no", p->nObjsPrev );
    if ( p->pCellStr )
        printf( "Symbolic cell description: %s\n", p->pCellStr );
    if ( p->pTtGia )
    fprintf( pFile, "Non-DSD AIG nodes          = %8d\n", Gia_ManAndNum(p->pTtGia) );
    fprintf( pFile, "Unique table misses        = %8d\n", p->nUniqueMisses );
    fprintf( pFile, "Unique table hits          = %8d\n", p->nUniqueHits );
    fprintf( pFile, "Memory used for objects    = %8.2f MB.\n", 1.0*Mem_FlexReadMemUsage(p->pMem)/(1<<20) );
    fprintf( pFile, "Memory used for functions  = %8.2f MB.\n", 8.0*(MemSizeTTs+sizeof(int)*Vec_IntCap(&p->vTruths))/(1<<20) );
    fprintf( pFile, "Memory used for hash table = %8.2f MB.\n", 1.0*sizeof(int)*(p->nBins+Vec_IntCap(&p->vNexts))/(1<<20) );
    fprintf( pFile, "Memory used for bound sets = %8.2f MB.\n", 1.0*MemSizeDecs/(1<<20) );
    fprintf( pFile, "Memory used for array      = %8.2f MB.\n", 1.0*sizeof(void *)*Vec_PtrCap(&p->vObjs)/(1<<20) );
    if ( p->pTtGia )
    fprintf( pFile, "Memory used for AIG        = %8.2f MB.\n", 8.0*Gia_ManAndNum(p->pTtGia)/(1<<20) );
    if ( p->timeDsd )
    {
        Abc_PrintTime( 1, "Time DSD   ", p->timeDsd    );
        Abc_PrintTime( 1, "Time canon ", p->timeCanon-p->timeCheck  );
        Abc_PrintTime( 1, "Time check ", p->timeCheck  );
        Abc_PrintTime( 1, "Time check2", p->timeCheck2 );
        Abc_PrintTime( 1, "Time verify", p->timeVerify );
    }
    if ( fOccurs )
        If_DsdManPrintOccurs( stdout, p );
//    If_DsdManHashProfile( p );
    if ( fTtDump )
        If_DsdManDumpDsd( p, Support );
    if ( fTtDump )
        If_DsdManDumpAll( p, Support );
//    If_DsdManPrintDecs( stdout, p );
    if ( !fVerbose )
        return;
    vStructs = Vec_IntAlloc( 1000 );
    vCounts  = Vec_IntAlloc( 1000 );
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        if ( Number && i % Number )
            continue;
        if ( Support && Support != If_DsdObjSuppSize(pObj) )
            continue;
        Vec_IntPush( vStructs, i );
        Vec_IntPush( vCounts, -(int)pObj->Count );
//        If_DsdManPrintOne( pFile, p, pObj->Id, NULL, 1 );
    }
//    fprintf( pFile, "\n" );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vCounts), Vec_IntSize(vCounts) );
    for ( i = 0; i < Abc_MinInt(Vec_IntSize(vCounts), 20); i++ )
    {
        printf( "%2d : ", i+1 );
        pObj = If_DsdVecObj( &p->vObjs, Vec_IntEntry(vStructs, pPerm[i]) );
        If_DsdManPrintOne( pFile, p, pObj->Id, NULL, 1 );
    }
    ABC_FREE( pPerm );
    Vec_IntFree( vStructs );
    Vec_IntFree( vCounts );
    if ( pFileName )
        fclose( pFile );
}